

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var cs::invoke<cs_impl::any,cs_impl::any>(var *func,any *_args,any *_args_1)

{
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  bool bVar1;
  string *str;
  proxy *in_RDI;
  vector args_1;
  object_method *om;
  vector args;
  any *in_stack_fffffffffffffe58;
  vector *in_stack_fffffffffffffe60;
  runtime_error *this;
  callable *in_stack_fffffffffffffe68;
  type_info *in_stack_fffffffffffffe70;
  allocator_type *in_stack_fffffffffffffe88;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffea0;
  undefined1 ****ppppuVar2;
  undefined8 ***local_158;
  any *in_stack_fffffffffffffee0;
  any *this_00;
  any *local_118;
  undefined1 local_e9 [41];
  undefined1 ***local_c0;
  undefined8 **local_b8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined1 ***local_a0;
  undefined8 local_98;
  object_method *local_78;
  any local_58 [2];
  any local_48;
  undefined8 local_40;
  
  cs_impl::any::type((any *)in_stack_fffffffffffffe60);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffe70,(type_info *)in_stack_fffffffffffffe68);
  if (bVar1) {
    cs_impl::any::any((any *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    cs_impl::any::any((any *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_40 = 2;
    local_48.mDat = (proxy *)local_58;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x5d7162);
    __l._M_len = in_stack_fffffffffffffea0;
    __l._M_array = in_stack_fffffffffffffe98;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffe90,__l,in_stack_fffffffffffffe88);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x5d7196);
    this_00 = local_58;
    local_118 = local_58 + 2;
    do {
      local_118 = local_118 + -1;
      cs_impl::any::~any((any *)0x5d71cb);
    } while (local_118 != this_00);
    cs_impl::any::const_val<cs::callable>(this_00);
    callable::call(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe70);
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffe60);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffe70,(type_info *)in_stack_fffffffffffffe68);
    if (!bVar1) {
      str = (string *)__cxa_allocate_exception(0x28);
      this = (runtime_error *)local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_e9 + 1),"Invoke non-callable object.",(allocator *)this);
      runtime_error::runtime_error(this,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_78 = cs_impl::any::const_val<cs::object_method>(in_stack_fffffffffffffee0);
    local_c0 = (undefined1 ***)&local_b8;
    cs_impl::any::any((any *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_c0 = (undefined1 ***)local_b0;
    cs_impl::any::any((any *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_c0 = (undefined1 ***)local_a8;
    cs_impl::any::any((any *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_a0 = (undefined1 ***)&local_b8;
    local_98 = 3;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x5d7374);
    __l_00._M_len = in_stack_fffffffffffffea0;
    __l_00._M_array = in_stack_fffffffffffffe98;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffe90,__l_00,in_stack_fffffffffffffe88);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x5d73a5);
    ppppuVar2 = (undefined1 ****)&local_b8;
    local_158 = &local_a0;
    do {
      local_158 = local_158 + -1;
      cs_impl::any::~any((any *)0x5d73ce);
    } while ((undefined1 ****)local_158 != ppppuVar2);
    cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffee0);
    callable::call(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe70);
  }
  return (var)in_RDI;
}

Assistant:

static var invoke(const var &func, ArgsT &&... _args)
	{
		if (func.type() == typeid(callable)) {
			vector args{std::forward<ArgsT>(_args)...};
			return func.const_val<callable>().call(args);
		}
		else if (func.type() == typeid(object_method)) {
			const auto &om = func.const_val<object_method>();
			vector args{om.object, std::forward<ArgsT>(_args)...};
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Invoke non-callable object.");
	}